

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall embree::HeightField::geometry(HeightField *this)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t sVar4;
  pointer pvVar5;
  Vec3fa *ptr;
  pointer pTVar6;
  int iVar7;
  undefined8 uVar8;
  OBJMaterial *this_00;
  TriangleMeshNode *this_01;
  Vec3fa *pVVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  size_t in_RSI;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_02;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  Ref<embree::SceneGraph::MaterialNode> local_a0;
  Node *local_98;
  size_t local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  long local_70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  char local_58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  local_98 = (Node *)this;
  local_90 = in_RSI;
  this_00 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_88._0_8_ = 0x3f8000003f800000;
  local_88._8_8_ = 0x3f8000003f800000;
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  OBJMaterial::OBJMaterial
            (this_00,1.0,(Vec3fa *)&local_88.field_1,(Vec3fa *)&local_48.field_1,1.0,
             (string *)&local_68.field_1);
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  if ((char *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  this_01 = (TriangleMeshNode *)operator_new(0xd8);
  local_a0.ptr = (MaterialNode *)this_00;
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
  SceneGraph::TriangleMeshNode::TriangleMeshNode(this_01,&local_a0,(BBox1f)0x3f8000003f800000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if ((OBJMaterial *)local_a0.ptr != (OBJMaterial *)0x0) {
    (*(((Node *)&((local_a0.ptr)->super_Node).super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  sVar4 = *(size_t *)(*(long *)(local_90 + 0x10) + 0x10);
  lVar11 = *(long *)(*(long *)(local_90 + 0x10) + 0x18);
  pvVar5 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar21 = lVar11 * sVar4;
  uVar10 = pvVar5->size_alloced;
  uVar14 = uVar10;
  if ((uVar10 < uVar21) && (uVar14 = uVar21, uVar10 != 0)) {
    while (uVar14 = uVar10, uVar14 < uVar21) {
      uVar10 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
    }
  }
  if (uVar21 < pvVar5->size_active) {
    pvVar5->size_active = uVar21;
  }
  if (pvVar5->size_alloced == uVar14) {
    pvVar5->size_active = uVar21;
  }
  else {
    ptr = pvVar5->items;
    pVVar9 = (Vec3fa *)alignedMalloc(uVar14 << 4,0x10);
    pvVar5->items = pVVar9;
    if (pvVar5->size_active != 0) {
      lVar20 = 0;
      uVar10 = 0;
      do {
        puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar20);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar20);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        uVar10 = uVar10 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar10 < pvVar5->size_active);
    }
    alignedFree(ptr);
    pvVar5->size_active = uVar21;
    pvVar5->size_alloced = uVar14;
  }
  if (lVar11 != 0) {
    local_70 = sVar4 << 4;
    lVar22 = 0;
    lVar20 = 0;
    do {
      if (sVar4 != 0) {
        sVar12 = 0;
        lVar19 = lVar22;
        do {
          at((HeightField *)&local_88.field_1,local_90,sVar12);
          puVar2 = (undefined8 *)
                   ((long)&((this_01->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar19);
          *puVar2 = local_88._0_8_;
          puVar2[1] = local_88._8_8_;
          sVar12 = sVar12 + 1;
          lVar19 = lVar19 + 0x10;
        } while (sVar4 != sVar12);
      }
      lVar20 = lVar20 + 1;
      lVar22 = lVar22 + local_70;
    } while (lVar20 != lVar11);
  }
  this_02 = &this_01->triangles;
  lVar11 = lVar11 + -1;
  lVar20 = sVar4 - 1;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_02,lVar20 * lVar11 * 2);
  if (lVar11 != 0) {
    lVar22 = 0;
    lVar19 = 0;
    lVar15 = 0;
    sVar12 = sVar4;
    do {
      if (lVar20 != 0) {
        lVar16 = lVar19;
        lVar18 = 0;
        do {
          lVar1 = lVar18 + 1;
          iVar7 = (int)lVar18;
          iVar13 = (int)lVar22 + iVar7 + 1;
          iVar17 = iVar7 + (int)sVar12;
          pTVar6 = (this_02->
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)&pTVar6->v0 + lVar16) = (int)lVar22 + iVar7;
          *(int *)((long)&pTVar6->v1 + lVar16) = iVar13;
          *(int *)((long)&pTVar6->v2 + lVar16) = iVar17;
          pTVar6 = (this_02->
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)&pTVar6[1].v0 + lVar16) = iVar13;
          *(int *)((long)&pTVar6[1].v1 + lVar16) = (int)sVar12 + iVar7 + 1;
          *(int *)((long)&pTVar6[1].v2 + lVar16) = iVar17;
          lVar16 = lVar16 + 0x18;
          lVar18 = lVar1;
        } while (lVar20 != lVar1);
      }
      lVar15 = lVar15 + 1;
      lVar19 = lVar19 + sVar4 * 0x18 + -0x18;
      sVar12 = sVar12 + sVar4;
      lVar22 = lVar22 + sVar4;
    } while (lVar15 != lVar11);
  }
  (local_98->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  (*(this_00->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
  return (Ref<embree::SceneGraph::Node>)local_98;
}

Assistant:

Ref<SceneGraph::Node> geometry()
    {
      Ref<SceneGraph::MaterialNode> mnode = new OBJMaterial(1.0f,Vec3fa(1.0f),Vec3fa(0.0f),1.0f);
      Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(mnode,1);

      const size_t width = texture->width;
      const size_t height = texture->height;
      
      mesh->positions[0].resize(height*width);
      for (size_t y=0; y<height; y++) 
        for (size_t x=0; x<width; x++) 
          mesh->positions[0][y*width+x] = at(x,y);

      mesh->triangles.resize(2*(height-1)*(width-1));
      for (size_t y=0; y<height-1; y++) {
        for (size_t x=0; x<width-1; x++) {
          const size_t p00 = (y+0)*width+(x+0);
          const size_t p01 = (y+0)*width+(x+1);
          const size_t p10 = (y+1)*width+(x+0);
          const size_t p11 = (y+1)*width+(x+1);
          const size_t tri = y*(width-1)+x;
          mesh->triangles[2*tri+0] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p00),unsigned(p01),unsigned(p10));
          mesh->triangles[2*tri+1] = SceneGraph::TriangleMeshNode::Triangle(unsigned(p01),unsigned(p11),unsigned(p10));
        }
      }
      return mesh.dynamicCast<SceneGraph::Node>();
    }